

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O1

CatalogEntry * __thiscall
duckdb::CatalogSet::GetEntryForTransaction
          (CatalogSet *this,CatalogTransaction transaction,CatalogEntry *current,bool *visible)

{
  ulong uVar1;
  bool bVar2;
  unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> *this_00;
  
  if ((current->child).
      super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t.
      super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
      super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl != (CatalogEntry *)0x0) {
    this_00 = &current->child;
    do {
      uVar1 = (current->timestamp).super___atomic_base<unsigned_long>._M_i;
      bVar2 = true;
      if ((transaction.transaction_id == uVar1) || (uVar1 < transaction.start_time))
      goto LAB_00d5894f;
      current = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::
                operator*(this_00);
      this_00 = &current->child;
    } while ((current->child).
             super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t
             .
             super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>
             .super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl !=
             (CatalogEntry *)0x0);
  }
  bVar2 = false;
LAB_00d5894f:
  *visible = bVar2;
  return current;
}

Assistant:

CatalogEntry &CatalogSet::GetEntryForTransaction(CatalogTransaction transaction, CatalogEntry &current, bool &visible) {
	reference<CatalogEntry> entry(current);
	while (entry.get().HasChild()) {
		if (UseTimestamp(transaction, entry.get().timestamp)) {
			visible = true;
			return entry.get();
		}
		entry = entry.get().Child();
	}
	visible = false;
	return entry.get();
}